

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint32 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Type *pTVar6;
  SliceLayerParams *pSVar7;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) {
LAB_0027b75f:
    pSVar7 = Specification::NeuralNetworkLayer::slice(layer);
    if ((int)pSVar7->stride_ < 1) {
      std::operator+(&local_a8,"Stride length for the slice layer \'",(layer->name_).ptr_);
      std::operator+(&err,&local_a8,"\' must be > 1.");
      std::__cxx11::string::~string((string *)&local_a8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      uVar3 = pSVar7->startindex_;
      uVar4 = pSVar7->endindex_;
      if (((long)uVar4 < 1 || (long)uVar3 <= (long)uVar4) &&
         (-1 < (long)(uVar4 & uVar3) || (long)uVar3 <= (long)uVar4)) {
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::operator+(&local_a8,"Slice layer ",(layer->name_).ptr_);
      std::operator+(&err,&local_a8," has an end index before the start index.");
      std::__cxx11::string::~string((string *)&local_a8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    goto LAB_0027b8fa;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Slice",(allocator<char> *)&err);
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&local_48);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
  uVar1 = pTVar6->rank_;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pSVar7 = Specification::NeuralNetworkLayer::slice(layer);
  iVar2 = pSVar7->axis_;
  if (iVar2 == 0) {
    if (2 < (int)uVar1) {
LAB_0027b757:
      std::__cxx11::string::~string((string *)&err);
      goto LAB_0027b75f;
    }
LAB_0027b83f:
    std::__cxx11::string::string((string *)&local_88,(string *)(layer->name_).ptr_);
    std::operator+(&local_68,"Slice layer \'",&local_88);
    std::operator+(&local_a8,&local_68,
                   "\': input\'s rank is smaller than the dimension provided in the axis parameter")
    ;
  }
  else {
    if (iVar2 == 1) {
      if (1 < (int)uVar1) goto LAB_0027b757;
      goto LAB_0027b83f;
    }
    if (iVar2 == 2) {
      if (0 < (int)uVar1) goto LAB_0027b757;
      goto LAB_0027b83f;
    }
    std::__cxx11::string::string((string *)&local_88,(string *)(layer->name_).ptr_);
    std::operator+(&local_68,"Slice layer: \'",&local_88);
    std::operator+(&local_a8,&local_68,"\': unknown value for parameter \'axis\'.");
  }
  std::__cxx11::string::operator=((string *)&err,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_0027b8fa:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Slice", blobNameToRank));
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.slice().axis()) {
            case Specification::SliceLayerParams_SliceAxis_CHANNEL_AXIS:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_HEIGHT_AXIS:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_WIDTH_AXIS:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            default:
                err = "Slice layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Slice layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimension provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    const auto& slice = layer.slice();
    int stride = static_cast<int>(slice.stride());
    if (stride < 1) {
        std::string err = "Stride length for the slice layer '" + layer.name() + "' must be > 1.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    int64_t start = (int64_t)slice.startindex();
    int64_t end = slice.endindex();
    if ((end > 0 && end < start )
        || (end < 0 && start < 0 && start > end)) {
        std::string err = "Slice layer " + layer.name() + " has an end index before the start index.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}